

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O1

Box ftxui::Box::Union(Box a,Box b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Box BVar5;
  
  uVar1 = a._0_8_;
  if (b.x_min < a.x_min) {
    uVar1 = b._0_8_;
  }
  uVar2 = b._0_8_;
  if (b.x_max < a.x_max) {
    uVar2 = a._0_8_;
  }
  uVar4 = a._8_8_ & 0xffffffff;
  if (b.y_min < a.y_min) {
    uVar4 = (ulong)(uint)b.y_min;
  }
  uVar3 = b._8_8_;
  if (b.y_max < a.y_max) {
    uVar3 = a._8_8_;
  }
  BVar5._0_8_ = uVar1 & 0xffffffff | uVar2 & 0xffffffff00000000;
  BVar5._8_8_ = uVar4 | uVar3 & 0xffffffff00000000;
  return BVar5;
}

Assistant:

Box Box::Union(Box a, Box b) {
  return Box{
      std::min(a.x_min, b.x_min),
      std::max(a.x_max, b.x_max),
      std::min(a.y_min, b.y_min),
      std::max(a.y_max, b.y_max),
  };
}